

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O3

bool __thiscall AbstractStringSerialiser::loadModel(AbstractStringSerialiser *this,QString *source)

{
  undefined1 uVar1;
  QString sourceCopy;
  QArrayData *local_20;
  char16_t *local_18;
  qsizetype local_10;
  
  local_20 = &((source->d).d)->super_QArrayData;
  local_18 = (source->d).ptr;
  local_10 = (source->d).size;
  if (local_20 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_20->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_20->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  uVar1 = (**(code **)(*(long *)&this->super_AbstractModelSerialiser + 200))(this,&local_20);
  if (local_20 != (QArrayData *)0x0) {
    LOCK();
    (local_20->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_20->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_20->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_20,2,8);
    }
  }
  return (bool)uVar1;
}

Assistant:

QVariant AbstractStringSerialiserPrivate::loadVariant(int type, const QString &val) const
{
    if (val.isEmpty())
        return QVariant();
    switch (type) {
    case QMetaType::UnknownType:
        Q_ASSERT_X(false, "ModelSerialisation::loadVariant", "Trying to load unregistered type.");
        return QVariant();
    case QMetaType::Bool:
        return val.toInt() == 1;
    case QMetaType::Long:
    case QMetaType::Int:
        return val.toInt();
    case QMetaType::ULong:
    case QMetaType::UInt:
        return val.toUInt();
    case QMetaType::LongLong:
        return val.toLongLong();
    case QMetaType::ULongLong:
        return val.toULongLong();
    case QMetaType::Double:
        return val.toDouble();
    case QMetaType::Short:
        return static_cast<short>(val.toInt());
    case QMetaType::SChar:
    case QMetaType::Char:
        return static_cast<char>(val.toInt());
    case QMetaType::UShort:
        return static_cast<unsigned short>(val.toUInt());
    case QMetaType::UChar:
        return static_cast<unsigned char>(val.toUInt());
    case QMetaType::Float:
        return val.toFloat();
    case QMetaType::QChar:
        return val.at(0);
    case QMetaType::QString:
        return val;
    case QMetaType::QByteArray:
        return QByteArray::fromBase64(val.toLatin1());
    case QMetaType::QDate:
        return QDate::fromString(val, Qt::ISODate);
    case QMetaType::QTime:
        return QTime::fromString(val, Qt::ISODate);
    case QMetaType::QDateTime:
        return QDateTime::fromString(val, Qt::ISODate);
#ifdef QT_GUI_LIB
    case QMetaType::QImage:
        return loadImageVariant(type, val);
    case QMetaType::QPixmap:
        return QPixmap::fromImage(loadImageVariant(type, val));
    case QMetaType::QBitmap:
        return QBitmap::fromImage(loadImageVariant(type, val));
#endif
    default:
        return stringToVariant(val);
    }
}